

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O3

string * google::protobuf::compiler::csharp::TryRemovePrefix
                   (string *__return_storage_ptr__,string *prefix,string *value)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pcVar4;
  ulong uVar5;
  char cVar6;
  string prefix_to_match;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  uVar2 = prefix->_M_string_length;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      if ((prefix->_M_dataplus)._M_p[uVar3] != '_') {
        std::__cxx11::string::push_back((char)&local_50);
        uVar2 = prefix->_M_string_length;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  uVar2 = value->_M_string_length;
  if (local_48 == 0) {
    uVar3 = 0;
  }
  else {
    pcVar4 = (value->_M_dataplus)._M_p;
    uVar3 = 0;
    uVar5 = 0;
    do {
      if (uVar2 == uVar3) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        goto LAB_00211246;
      }
      cVar1 = pcVar4[uVar3];
      if (cVar1 != '_') {
        cVar6 = cVar1 + ' ';
        if (0x19 < (byte)(cVar1 + 0xbfU)) {
          cVar6 = cVar1;
        }
        if (cVar6 != *(char *)((long)local_50 + uVar5)) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,pcVar4,pcVar4 + uVar2);
          goto LAB_0021127c;
        }
        uVar5 = uVar5 + 1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar5 < local_48);
  }
  if (uVar3 < uVar2) {
    do {
      if ((value->_M_dataplus)._M_p[uVar3] != '_') goto LAB_0021122e;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  else {
LAB_0021122e:
    if (uVar3 != uVar2) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)value);
      goto LAB_0021127c;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar4 = (value->_M_dataplus)._M_p;
LAB_00211246:
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar4,pcVar4 + uVar2);
LAB_0021127c:
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TryRemovePrefix(const std::string& prefix, const std::string& value) {
  // First normalize to a lower-case no-underscores prefix to match against
  std::string prefix_to_match = "";
  for (size_t i = 0; i < prefix.size(); i++) {
    if (prefix[i] != '_') {
      prefix_to_match += ascii_tolower(prefix[i]);
    }
  }
  
  // This keeps track of how much of value we've consumed
  size_t prefix_index, value_index;
  for (prefix_index = 0, value_index = 0;
      prefix_index < prefix_to_match.size() && value_index < value.size();
      value_index++) {
    // Skip over underscores in the value
    if (value[value_index] == '_') {
      continue;
    }
    if (ascii_tolower(value[value_index]) != prefix_to_match[prefix_index++]) {
      // Failed to match the prefix - bail out early.
      return value;
    }
  }

  // If we didn't finish looking through the prefix, we can't strip it.
  if (prefix_index < prefix_to_match.size()) {
    return value;
  }

  // Step over any underscores after the prefix
  while (value_index < value.size() && value[value_index] == '_') {
    value_index++;
  }

  // If there's nothing left (e.g. it was a prefix with only underscores afterwards), don't strip.
  if (value_index == value.size()) {
    return value;
  }

  return value.substr(value_index);
}